

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.hpp
# Opt level: O0

unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridFourier>::read<TasGrid::IO::mode_ascii_type>
          (GridReaderVersion5<TasGrid::GridFourier> *this,AccelerationContext *acc,istream *is)

{
  istream *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pGVar5;
  reference piVar6;
  int in_R8D;
  MultiIndexSet *local_360;
  vector<int,_std::allocator<int>_> local_2e8;
  OneDimensionalWrapper local_2d0;
  int *local_218;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_210;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_208;
  vector<int,_std::allocator<int>_> local_200;
  MultiIndexSet local_1e0;
  MultiIndexSet local_1b0;
  int local_184;
  undefined1 local_180 [4];
  int oned_max_level;
  StorageSet local_150;
  vector<int,_std::allocator<int>_> local_128;
  MultiIndexSet local_108;
  MultiIndexSet local_d8;
  vector<int,_std::allocator<int>_> local_b0;
  MultiIndexSet local_90;
  MultiIndexSet local_60;
  undefined1 local_21;
  istream *local_20;
  istream *is_local;
  AccelerationContext *acc_local;
  unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_> *grid;
  
  local_21 = 0;
  local_20 = is;
  is_local = (istream *)acc;
  acc_local = (AccelerationContext *)this;
  Utils::make_unique<TasGrid::GridFourier,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,(AccelerationContext **)&is_local);
  iVar3 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  (pGVar5->super_BaseCanonicalGrid).num_dimensions = iVar3;
  iVar3 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  (pGVar5->super_BaseCanonicalGrid).num_outputs = iVar3;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_60,local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  MultiIndexSet::operator=(&pGVar5->tensors,&local_60);
  MultiIndexSet::~MultiIndexSet(&local_60);
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_90,local_20);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  MultiIndexSet::operator=(&pGVar5->active_tensors,&local_90);
  MultiIndexSet::~MultiIndexSet(&local_90);
  piVar1 = local_20;
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  uVar4 = MultiIndexSet::getNumIndexes(&pGVar5->active_tensors);
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            (&local_b0,(IO *)piVar1,(istream *)(ulong)uVar4,iVar3);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar5->active_w,&local_b0);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_b0);
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_d8,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar5->super_BaseCanonicalGrid).points,&local_d8);
    MultiIndexSet::~MultiIndexSet(&local_d8);
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_108,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    MultiIndexSet::operator=(&(pGVar5->super_BaseCanonicalGrid).needed,&local_108);
    MultiIndexSet::~MultiIndexSet(&local_108);
  }
  piVar1 = local_20;
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
            (&local_128,(IO *)piVar1,
             (istream *)(ulong)(uint)(pGVar5->super_BaseCanonicalGrid).num_dimensions,iVar3);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar5->max_levels,&local_128);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_128);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  if (0 < (pGVar5->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_ascii_type>(&local_150,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    StorageSet::operator=(&(pGVar5->super_BaseCanonicalGrid).values,&local_150);
    StorageSet::~StorageSet(&local_150);
    bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
    piVar1 = local_20;
    if (bVar2) {
      pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
               operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                           *)this);
      uVar4 = (pGVar5->super_BaseCanonicalGrid).num_outputs;
      pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
               operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                           *)this);
      iVar3 = MultiIndexSet::getNumIndexes(&(pGVar5->super_BaseCanonicalGrid).points);
      iVar3 = iVar3 * 2;
      IO::readData2D<TasGrid::IO::mode_ascii_type,double,int,int>
                ((Data2D<double> *)local_180,(IO *)piVar1,(istream *)(ulong)uVar4,iVar3,in_R8D);
      pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
               operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                           *)this);
      Data2D<double>::operator=(&pGVar5->fourier_coefs,(Data2D<double> *)local_180);
      Data2D<double>::~Data2D((Data2D<double> *)local_180);
    }
  }
  bVar2 = IO::readFlag<TasGrid::IO::mode_ascii_type>(local_20);
  if (bVar2) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_1b0,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    MultiIndexSet::operator=(&pGVar5->updated_tensors,&local_1b0);
    MultiIndexSet::~MultiIndexSet(&local_1b0);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    local_184 = MultiIndexSet::getMaxIndex(&pGVar5->updated_tensors);
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_ascii_type>(&local_1e0,local_20);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    MultiIndexSet::operator=(&pGVar5->updated_active_tensors,&local_1e0);
    MultiIndexSet::~MultiIndexSet(&local_1e0);
    piVar1 = local_20;
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    uVar4 = MultiIndexSet::getNumIndexes(&pGVar5->updated_active_tensors);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,int>
              (&local_200,(IO *)piVar1,(istream *)(ulong)uVar4,iVar3);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    ::std::vector<int,_std::allocator<int>_>::operator=(&pGVar5->updated_active_w,&local_200);
    ::std::vector<int,_std::allocator<int>_>::~vector(&local_200);
  }
  else {
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    local_210._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin(&pGVar5->max_levels);
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    local_218 = (int *)::std::vector<int,_std::allocator<int>_>::end(&pGVar5->max_levels);
    local_208 = ::std::
                max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          (local_210,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           local_218);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_208);
    local_184 = *piVar6;
  }
  OneDimensionalWrapper::OneDimensionalWrapper(&local_2d0,local_184,rule_fourier,0.0,0.0);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  OneDimensionalWrapper::operator=(&pGVar5->wrapper,&local_2d0);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_2d0);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  bVar2 = MultiIndexSet::empty(&(pGVar5->super_BaseCanonicalGrid).points);
  if (bVar2) {
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    local_360 = &(pGVar5->super_BaseCanonicalGrid).needed;
  }
  else {
    pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
             operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                         *)this);
    local_360 = &(pGVar5->super_BaseCanonicalGrid).points;
  }
  MultiIndexManipulations::getMaxIndexes(&local_2e8,local_360);
  pGVar5 = ::std::unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>::
           operator->((unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_>
                       *)this);
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&pGVar5->max_power,(vector<int,_std::allocator<int>_> *)&local_2e8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&local_2e8)
  ;
  return (__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridFourier> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridFourier> grid = Utils::make_unique<GridFourier>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);

        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0){
            grid->values = StorageSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->fourier_coefs = IO::readData2D<iomode, double>(is, grid->num_outputs, 2 * grid->points.getNumIndexes());
        }

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(oned_max_level, rule_fourier, 0.0, 0.0);

        grid->max_power = MultiIndexManipulations::getMaxIndexes(((grid->points.empty()) ? grid->needed : grid->points));

        return grid;
    }